

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QString * __thiscall
QRegularExpression::errorString(QString *__return_storage_ptr__,QRegularExpression *this)

{
  int iVar1;
  uint uVar2;
  QChar *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QRegularExpressionPrivate::compilePattern((this->d).d.ptr);
  if (((this->d).d.ptr)->errorCode == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QCoreApplication::translate
                (__return_storage_ptr__,"QRegularExpression","no error",(char *)0x0,-1);
      return __return_storage_ptr__;
    }
  }
  else {
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    do {
      QString::resize((QString *)&local_48,local_48.size + 0x40);
      iVar1 = ((this->d).d.ptr)->errorCode;
      pQVar3 = QString::data((QString *)&local_48);
      uVar2 = pcre2_get_error_message_16(iVar1,pQVar3,local_48.size);
    } while ((int)uVar2 < 0);
    QString::resize((QString *)&local_48,(ulong)uVar2);
    QString::toLatin1_helper_inplace((QByteArray *)&local_60,(QString *)&local_48);
    if (local_60.ptr == (char *)0x0) {
      local_60.ptr = &QByteArray::_empty;
    }
    QCoreApplication::translate
              (__return_storage_ptr__,"QRegularExpression",local_60.ptr,(char *)0x0,-1);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QRegularExpression::errorString() const
{
    d.data()->compilePattern();
    if (d->errorCode) {
        QString errorString;
        int errorStringLength;
        do {
            errorString.resize(errorString.size() + 64);
            errorStringLength = pcre2_get_error_message_16(d->errorCode,
                                                           reinterpret_cast<ushort *>(errorString.data()),
                                                           errorString.size());
        } while (errorStringLength < 0);
        errorString.resize(errorStringLength);

#ifdef QT_NO_TRANSLATION
        return errorString;
#else
        return QCoreApplication::translate("QRegularExpression", std::move(errorString).toLatin1().constData());
#endif
    }
#ifdef QT_NO_TRANSLATION
        return u"no error"_s;
#else
    return QCoreApplication::translate("QRegularExpression", "no error");
#endif
}